

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

bool __thiscall nite::Texture::load(Texture *this,string *path,Color *transparency)

{
  pointer *pppTVar1;
  uchar *puVar2;
  Color *pCVar3;
  iterator iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  string *__rhs;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uchar *img_data;
  long *plVar11;
  undefined8 *puVar12;
  size_t in_RCX;
  long lVar13;
  ulong *puVar14;
  Texture *pTVar15;
  bool *pbVar16;
  size_type *psVar17;
  int *piVar18;
  long lVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  pointer ptVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [16];
  undefined1 local_168 [120];
  string local_f0;
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [8];
  string fileHash;
  ulong local_90;
  long lStack_88;
  long local_80;
  Texture *local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Color *local_48;
  Color *tr;
  int local_38;
  int Channels;
  int Width;
  int Height;
  
  bVar8 = fileExists(path);
  if (!bVar8) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "fail to load texture \'",path);
    plVar11 = (long *)std::__cxx11::string::append((char *)local_c0);
    psVar17 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar17) {
      local_168._0_8_ = *psVar17;
      local_168._8_8_ = plVar11[3];
      local_178._0_8_ = local_168;
    }
    else {
      local_168._0_8_ = *psVar17;
      local_178._0_8_ = (size_type *)*plVar11;
    }
    local_178._8_8_ = plVar11[1];
    *plVar11 = (long)psVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    print((string *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_c0 != (undefined1  [8])&fileHash._M_string_length) {
      operator_delete((void *)local_c0);
    }
    return false;
  }
  local_78 = this;
  local_48 = transparency;
  unload(this);
  local_70 = path;
  hashMemory_abi_cxx11_
            ((string *)local_c0,(nite *)(path->_M_dataplus)._M_p,(char *)path->_M_string_length,
             in_RCX);
  ptVar23 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_80 = ((long)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
  local_c8 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_d0 = (pointer)local_c0;
    uVar21 = local_80 + (ulong)(local_80 == 0);
    psVar17 = &((textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                 super__Vector_impl_data._M_start)->Hash)._M_string_length;
    uVar22 = 0;
    do {
      if (((*(char *)((long)psVar17 + -0xc) == '\0') &&
          ((pointer)*psVar17 == fileHash._M_dataplus._M_p)) &&
         ((fileHash._M_dataplus._M_p == (pointer)0x0 ||
          (iVar9 = bcmp((((string *)(psVar17 + -1))->_M_dataplus)._M_p,local_d0,
                        (size_t)fileHash._M_dataplus._M_p), iVar9 == 0)))) {
        pTVar15 = local_78;
        piVar18 = &local_78->objectId;
        uVar10 = (uint)uVar22;
        local_78->objectId = uVar10;
        if ((int)uVar10 < 0) goto LAB_00196ba4;
        uVar10 = uVar10 & 0x7fffffff;
        local_178._0_8_ = local_78;
        iVar4._M_current =
             ptVar23[uVar10].owners.
             super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            ptVar23[uVar10].owners.
            super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<nite::Texture*,std::allocator<nite::Texture*>>::
          _M_realloc_insert<nite::Texture*>
                    ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)
                     &ptVar23[uVar10].owners,iVar4,(Texture **)local_178);
          uVar22 = (ulong)(uint)*piVar18;
        }
        else {
          *iVar4._M_current = local_78;
          pppTVar1 = &ptVar23[uVar10].owners.
                      super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        Rect::set(&pTVar15->region,0.0,0.0,
                  (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl
                         .super__Vector_impl_data._M_start[(int)uVar22].Width,
                  (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl
                         .super__Vector_impl_data._M_start[(int)uVar22].Height);
        bVar8 = false;
        goto LAB_001972f7;
      }
      uVar22 = uVar22 + 1;
      psVar17 = psVar17 + 0x11;
    } while (uVar21 != uVar22);
  }
  piVar18 = &local_78->objectId;
  local_78->objectId = -1;
LAB_00196ba4:
  pTVar15 = local_78;
  lVar19 = local_80;
  if (local_c8 != ptVar23) {
    pbVar16 = &ptVar23->empty;
    lVar13 = 0;
    do {
      if (*pbVar16 != false) goto LAB_00196cc1;
      lVar13 = lVar13 + 1;
      pbVar16 = pbVar16 + 0x88;
    } while (local_80 + (ulong)(local_80 == 0) != lVar13);
  }
  textureT::textureT((textureT *)local_178);
  std::vector<textureT,_std::allocator<textureT>_>::emplace_back<textureT>
            (&textureList,(textureT *)local_178);
  textureT::~textureT((textureT *)local_178);
  ptVar23 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar13 = lVar19;
LAB_00196cc1:
  uVar10 = (uint)lVar13;
  pTVar15->objectId = uVar10;
  ptVar23[(int)uVar10].empty = false;
  local_178._0_8_ = pTVar15;
  iVar4._M_current =
       ptVar23[(int)uVar10].owners.
       super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      ptVar23[(int)uVar10].owners.
      super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<nite::Texture*,std::allocator<nite::Texture*>>::_M_realloc_insert<nite::Texture*>
              ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)&ptVar23[(int)uVar10].owners
               ,iVar4,(Texture **)local_178);
    uVar10 = *piVar18;
  }
  else {
    *iVar4._M_current = pTVar15;
    pppTVar1 = &ptVar23[(int)uVar10].owners.
                super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  __rhs = local_70;
  std::__cxx11::string::_M_assign
            ((string *)
             &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar10].Hash);
  std::__cxx11::string::_M_assign
            ((string *)
             &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar18].filename);
  img_data = SOIL_load_image((__rhs->_M_dataplus)._M_p,&local_38,&Channels,(int *)((long)&tr + 4),0)
  ;
  bVar8 = img_data != (uchar *)0x0;
  if (img_data == (uchar *)0x0) {
    std::operator+(&local_68,"failed to load texture \'",__rhs);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
    pTVar15 = (Texture *)(puVar12 + 2);
    if ((Texture *)*puVar12 == pTVar15) {
      local_168._0_8_ = (pTVar15->filename)._M_dataplus._M_p;
      local_168._8_8_ = puVar12[3];
      local_178._0_8_ = (Texture *)local_168;
    }
    else {
      local_168._0_8_ = (pTVar15->filename)._M_dataplus._M_p;
      local_178._0_8_ = (Texture *)*puVar12;
    }
    local_178._8_8_ = puVar12[1];
    *puVar12 = pTVar15;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    print((string *)local_178);
    if ((Texture *)local_178._0_8_ != (Texture *)local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    goto LAB_001972f7;
  }
  if (((local_48->a != -1.0) || (NAN(local_48->a))) && (0 < Channels * local_38 * tr._4_4_)) {
    lVar19 = 0;
    do {
      fVar5 = local_48->r * 255.0;
      if ((fVar5 == (float)img_data[lVar19]) && (!NAN(fVar5) && !NAN((float)img_data[lVar19]))) {
        fVar5 = local_48->g * 255.0;
        if ((fVar5 == (float)img_data[lVar19 + 1]) &&
           (!NAN(fVar5) && !NAN((float)img_data[lVar19 + 1]))) {
          fVar5 = local_48->b * 255.0;
          if ((fVar5 == (float)img_data[lVar19 + 2]) &&
             (!NAN(fVar5) && !NAN((float)img_data[lVar19 + 2]))) {
            puVar2 = img_data + lVar19;
            puVar2[0] = '\0';
            puVar2[1] = '\0';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
          }
        }
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 < Channels * local_38 * tr._4_4_);
  }
  glEnable(0xde1);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameterf(0x47012f00,0xde1,0x2802);
  glTexParameterf(0x47012f00,0xde1,0x2803);
  glGenTextures(1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                  super__Vector_impl_data._M_start + *piVar18);
  glBindTexture(0xde1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar18].texture);
  glTexImage2D(0xde1,0,0x1908,local_38,Channels,0,0x1908,0x1401,img_data);
  glBindTexture(0xde1,0);
  glDisable(0xde1);
  ptVar23 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar9 = pTVar15->objectId;
  textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
  super__Vector_impl_data._M_start[iVar9].id = iVar9;
  ptVar23[iVar9].Width = local_38;
  ptVar23[iVar9].Height = Channels;
  ptVar23[iVar9].Channels = tr._4_4_;
  fVar5 = local_48->g;
  fVar6 = local_48->b;
  fVar7 = local_48->a;
  pCVar3 = &ptVar23[iVar9].transparency;
  pCVar3->r = local_48->r;
  pCVar3->g = fVar5;
  pCVar3->b = fVar6;
  pCVar3->a = fVar7;
  std::__cxx11::string::_M_assign((string *)pTVar15);
  Rect::set(&pTVar15->region,0.0,0.0,(float)local_38,(float)Channels);
  std::operator+(&local_198,"loaded texture \'",__rhs);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar14 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar14) {
    local_90 = *puVar14;
    lStack_88 = plVar11[3];
    fileHash.field_2._8_8_ = &local_90;
  }
  else {
    local_90 = *puVar14;
    fileHash.field_2._8_8_ = (ulong *)*plVar11;
  }
  lVar19 = plVar11[1];
  *plVar11 = (long)puVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  toStr_abi_cxx11_(&local_f0,(nite *)(ulong)(uint)*piVar18,(int)lVar19);
  uVar21 = local_f0._M_string_length + lVar19;
  uVar22 = 0xf;
  if ((ulong *)fileHash.field_2._8_8_ != &local_90) {
    uVar22 = local_90;
  }
  if (uVar22 < uVar21) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar20 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < uVar21) goto LAB_0019712e;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,fileHash.field_2._8_8_);
  }
  else {
LAB_0019712e:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        (fileHash.field_2._M_local_buf + 8,(ulong)local_f0._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  psVar17 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_68.field_2._M_allocated_capacity = *psVar17;
    local_68.field_2._8_8_ = puVar12[3];
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar17;
    local_68._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_68._M_string_length = puVar12[1];
  *puVar12 = psVar17;
  puVar12[1] = 0;
  *(undefined1 *)psVar17 = 0;
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
  pTVar15 = (Texture *)(puVar12 + 2);
  if ((Texture *)*puVar12 == pTVar15) {
    local_168._0_8_ = (pTVar15->filename)._M_dataplus._M_p;
    local_168._8_8_ = puVar12[3];
    local_178._0_8_ = (Texture *)local_168;
  }
  else {
    local_168._0_8_ = (pTVar15->filename)._M_dataplus._M_p;
    local_178._0_8_ = (Texture *)*puVar12;
  }
  local_178._8_8_ = puVar12[1];
  *puVar12 = pTVar15;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  print((string *)local_178);
  if ((Texture *)local_178._0_8_ != (Texture *)local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((ulong *)fileHash.field_2._8_8_ != &local_90) {
    operator_delete((void *)fileHash.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  SOIL_free_image_data(img_data);
LAB_001972f7:
  if (local_c0 != (undefined1  [8])&fileHash._M_string_length) {
    operator_delete((void *)local_c0);
  }
  return bVar8;
}

Assistant:

bool nite::Texture::load(const String &path, const nite::Color &transparency){
	if(!nite::fileExists(path)){
		nite::print("fail to load texture '"+path+"': it doesn't exist");
		return false;
	}
	unload();
	String fileHash = nite::hashMemory((char*)path.c_str(), path.length());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		textureList[objectId].empty = 0;
		textureList[objectId].owners.push_back(this);
		textureList[objectId].Hash = fileHash;
    	textureList[objectId].filename = path;
	}else{
		textureList[objectId].owners.push_back(this);
		region.set(0, 0, textureList[objectId].Width, textureList[objectId].Height);
		return false;
	}

	int Width;
	int Height;
	int Channels;
	GLubyte *Pixels = SOIL_load_image(path.c_str(), &Width, &Height, &Channels, SOIL_LOAD_AUTO);
	if (Pixels == NULL){
		nite::print("failed to load texture '"+path+"': unsupported format");
		return false;
	}
	if(transparency.a != -1.0){
		for(int i = 0; i < Width * Height * Channels; i += 4){
			const nite::Color &tr = transparency;
			#define uchar unsigned char
			uchar &r = Pixels[i];
			uchar &g = Pixels[i + 1];
			uchar &b = Pixels[i + 2];
			uchar &a = Pixels[i + 3];
			if(r == (tr.r * 255.0) && g == (tr.g * 255.0) && b == (tr.b * 255.0)){
				r = 0; g = 0;	b = 0; a = 0;
			}
		}
	}
	glEnable(GL_TEXTURE_2D);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	glGenTextures(1, &textureList[objectId].texture);
	glBindTexture(GL_TEXTURE_2D, textureList[objectId].texture);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, Width, Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, Pixels);
	glBindTexture(GL_TEXTURE_2D, 0);
	glDisable(GL_TEXTURE_2D);
	textureList[objectId].id = objectId;
	textureList[objectId].Width	= Width;
	textureList[objectId].Height = Height;
	textureList[objectId].Channels = Channels;
	textureList[objectId].transparency = transparency;
	this->filename = path;
	region.set(0, 0, Width, Height);
	nite::print("loaded texture '"+path+"'("+nite::toStr(objectId)+")");
	SOIL_free_image_data(Pixels);
	return true;
}